

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImVec2 *pIVar1;
  float fVar2;
  ImGuiWindow *this;
  ImVec2 IVar3;
  ImDrawList *draw_list;
  ImVec2 IVar4;
  byte bVar5;
  ImGuiContext *pIVar6;
  char *pcVar7;
  bool bVar8;
  ImS8 IVar9;
  ImU32 id;
  int iVar10;
  ImU32 col;
  ImGuiID close_button_id;
  ImGuiTabItem *pIVar11;
  size_t sVar12;
  char *pcVar13;
  int iVar14;
  ImGuiTabItemFlags flags_00;
  int iVar15;
  long lVar16;
  ImGuiTabItem *pIVar17;
  ImGuiCol idx;
  byte bVar18;
  uint uVar19;
  int iVar20;
  bool bVar21;
  float fVar22;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ImRect bb;
  bool held;
  bool hovered;
  ImRect local_88;
  uint local_74;
  int local_70;
  uint local_6c;
  ImVec2 local_68;
  ImVec2 local_60;
  bool *local_58;
  int local_50;
  int local_4c;
  undefined1 local_48 [16];
  char *local_38;
  
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  pIVar6 = GImGui;
  this = GImGui->CurrentWindow;
  if (this->SkipItems != false) {
    return false;
  }
  id = TabBarCalcTabID((ImGuiTabBar *)(ulong)(uint)tab_bar->Flags,label);
  if ((p_open != (bool *)0x0) && (*p_open == false)) {
    PushItemFlag(0x18,true);
    local_88.Min.x = 3.4028235e+38;
    local_88.Min.y = 3.4028235e+38;
    local_88.Max.x = -3.4028235e+38;
    local_88.Max.y = -3.4028235e+38;
    ItemAdd(&local_88,id,(ImRect *)0x0);
    PopItemFlag();
    return false;
  }
  IVar4 = TabItemCalcSize(label,p_open != (bool *)0x0);
  fVar22 = IVar4.x;
  uVar19 = (tab_bar->Tabs).Size;
  local_48._8_4_ = extraout_XMM0_Dc;
  local_48._0_4_ = IVar4.x;
  local_48._4_4_ = IVar4.y;
  local_48._12_4_ = extraout_XMM0_Dd;
  local_58 = p_open;
  local_38 = label;
  if (0 < (int)uVar19 && id != 0) {
    pIVar11 = (tab_bar->Tabs).Data;
    lVar16 = 0;
    do {
      if (*(ImU32 *)((long)&pIVar11->ID + lVar16) == id) {
        pIVar17 = (ImGuiTabItem *)((long)&pIVar11->ID + lVar16);
        bVar5 = 0;
        goto LAB_002ef2eb;
      }
      lVar16 = lVar16 + 0x20;
    } while ((ulong)uVar19 << 5 != lVar16);
  }
  if (uVar19 == (tab_bar->Tabs).Capacity) {
    if (uVar19 == 0) {
      iVar14 = 8;
    }
    else {
      iVar14 = (int)uVar19 / 2 + uVar19;
    }
    iVar15 = uVar19 + 1;
    if ((int)(uVar19 + 1) < iVar14) {
      iVar15 = iVar14;
    }
    pIVar11 = (ImGuiTabItem *)MemAlloc((long)iVar15 << 5);
    pIVar17 = (tab_bar->Tabs).Data;
    if (pIVar17 != (ImGuiTabItem *)0x0) {
      memcpy(pIVar11,pIVar17,(long)(tab_bar->Tabs).Size << 5);
      MemFree((tab_bar->Tabs).Data);
    }
    (tab_bar->Tabs).Data = pIVar11;
    (tab_bar->Tabs).Capacity = iVar15;
    uVar19 = (tab_bar->Tabs).Size;
    fVar22 = (float)local_48._0_4_;
  }
  else {
    pIVar11 = (tab_bar->Tabs).Data;
  }
  pIVar17 = pIVar11 + (int)uVar19;
  pIVar17->ID = 0;
  pIVar17->Flags = 0;
  pIVar17->LastFrameVisible = -1;
  pIVar17->LastFrameSelected = -1;
  pIVar11[(int)uVar19].NameOffset = -1;
  pIVar11[(int)uVar19].Offset = 0.0;
  pIVar11[(int)uVar19].Width = 0.0;
  pIVar11[(int)uVar19].WidthContents = 0.0;
  iVar14 = (tab_bar->Tabs).Size;
  uVar19 = iVar14 + 1;
  (tab_bar->Tabs).Size = uVar19;
  if (iVar14 < 0) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui.h"
                  ,0x4e8,"T &ImVector<ImGuiTabItem>::back() [T = ImGuiTabItem]");
  }
  pIVar11 = (tab_bar->Tabs).Data;
  pIVar17 = pIVar11 + ((ulong)uVar19 - 1);
  pIVar17->ID = id;
  pIVar11[(ulong)uVar19 - 1].Width = fVar22;
  bVar5 = 1;
LAB_002ef2eb:
  pcVar7 = local_38;
  if ((pIVar17 < pIVar11) || (pIVar11 + (int)uVar19 < pIVar17)) {
    __assert_fail("it >= Data && it <= Data+Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui.h"
                  ,0x4fa,
                  "int ImVector<ImGuiTabItem>::index_from_ptr(const T *) const [T = ImGuiTabItem]");
  }
  tab_bar->LastTabItemIdx = (short)((uint)((int)pIVar17 - (int)pIVar11) >> 5);
  local_6c = flags | 0x100000;
  if (local_58 != (bool *)0x0) {
    local_6c = flags;
  }
  pIVar17->WidthContents = fVar22;
  local_74 = tab_bar->Flags;
  local_70 = tab_bar->PrevFrameVisible + 1;
  iVar14 = pIVar6->FrameCount;
  iVar20 = pIVar17->LastFrameVisible + 1;
  pIVar17->LastFrameVisible = iVar14;
  pIVar17->Flags = local_6c;
  iVar15 = (tab_bar->TabsNames).Buf.Size;
  iVar10 = iVar15 + -1;
  if (iVar15 == 0) {
    iVar10 = 0;
  }
  pIVar17->NameOffset = iVar10;
  sVar12 = strlen(local_38);
  ImGuiTextBuffer::append(&tab_bar->TabsNames,pcVar7,pcVar7 + sVar12 + 1);
  uVar19 = tab_bar->Flags;
  bVar18 = iVar20 < iVar14;
  if (iVar20 < iVar14) {
    if ((((uVar19 & 2) != 0) && (tab_bar->NextSelectedTabId == 0)) &&
       ((iVar14 <= local_70 || (tab_bar->SelectedTabId == 0)))) {
      tab_bar->NextSelectedTabId = id;
    }
  }
  else if ((uVar19 & 1) == 0) {
    fVar22 = tab_bar->OffsetNextTab;
    pIVar17->Offset = fVar22;
    tab_bar->OffsetNextTab = pIVar17->Width + (pIVar6->Style).ItemInnerSpacing.x + fVar22;
  }
  if (((local_6c & 2) != 0) && (tab_bar->SelectedTabId != id)) {
    tab_bar->NextSelectedTabId = id;
  }
  if (tab_bar->VisibleTabId == id) {
    tab_bar->VisibleTabWasSubmitted = true;
    bVar21 = true;
  }
  else if ((tab_bar->SelectedTabId == 0 && local_70 < iVar14) && ((tab_bar->Tabs).Size == 1)) {
    bVar21 = (uVar19 & 2) == 0;
  }
  else {
    bVar21 = false;
  }
  if ((bool)((bVar5 | iVar14 <= local_70) & iVar20 < iVar14)) {
    PushItemFlag(0x18,true);
    local_88.Min.x = 3.4028235e+38;
    local_88.Min.y = 3.4028235e+38;
    local_88.Max.x = -3.4028235e+38;
    local_88.Max.y = -3.4028235e+38;
    ItemAdd(&local_88,id,(ImRect *)0x0);
    PopItemFlag();
    return bVar21;
  }
  if (tab_bar->SelectedTabId == id) {
    pIVar17->LastFrameSelected = pIVar6->FrameCount;
  }
  IVar3 = (this->DC).CursorPos;
  local_88.Max.x = pIVar17->Width;
  IVar4 = (tab_bar->BarRect).Min;
  local_88.Min.x = ((float)(int)pIVar17->Offset - tab_bar->ScrollingAnim) + IVar4.x;
  local_88.Min.y = IVar4.y + 0.0;
  IVar4.y = local_88.Min.y;
  IVar4.x = local_88.Min.x;
  (this->DC).CursorPos = IVar4;
  local_88.Max.x = local_88.Max.x + local_88.Min.x;
  local_88.Max.y = (float)local_48._4_4_ + local_88.Min.y;
  fVar22 = (tab_bar->BarRect).Min.x;
  fVar2 = (tab_bar->BarRect).Max.x;
  uVar19 = -(uint)(local_88.Min.x < fVar22 || fVar2 <= local_88.Max.x);
  local_48._0_4_ = uVar19;
  local_50 = iVar20;
  local_4c = iVar14;
  if ((uVar19 & 1) != 0) {
    local_60.y = local_88.Min.y + -1.0;
    local_60.x = (float)(~-(uint)(fVar22 <= local_88.Min.x) & (uint)fVar22 |
                        -(uint)(fVar22 <= local_88.Min.x) & (uint)local_88.Min.x);
    local_68.x = fVar2;
    local_68.y = local_88.Max.y;
    PushClipRect(&local_60,&local_68,true);
  }
  local_60.x = local_88.Max.x - local_88.Min.x;
  local_60.y = local_88.Max.y - local_88.Min.y;
  IVar4 = (this->DC).CursorMaxPos;
  ItemSize(&local_60,(pIVar6->Style).FramePadding.y);
  (this->DC).CursorMaxPos = IVar4;
  bVar8 = ItemAdd(&local_88,id,(ImRect *)0x0);
  if (!bVar8) {
    if ((local_48 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      PopClipRect();
    }
    (this->DC).CursorPos = IVar3;
    return bVar21;
  }
  bVar8 = ButtonBehavior(&local_88,id,(bool *)&local_60,(bool *)&local_68,
                         (uint)pIVar6->DragDropActive << 0xc | 0x44);
  if (bVar8) {
    tab_bar->NextSelectedTabId = id;
  }
  local_60.x._0_1_ = local_60.x._0_1_ | pIVar6->HoveredId == id;
  if (local_68.x._0_1_ == '\0') {
    bVar8 = local_50 < local_4c;
    SetItemAllowOverlap();
    bVar18 = local_68.x._0_1_ ^ 1 | bVar8;
  }
  pcVar7 = local_38;
  if (((((bVar18 & 1) == 0) && (bVar8 = IsMouseDragging(0,-1.0), bVar8)) &&
      (pIVar6->DragDropActive == false)) && ((tab_bar->Flags & 1) != 0)) {
    fVar22 = (pIVar6->IO).MouseDelta.x;
    if ((0.0 <= fVar22) ||
       (pIVar1 = &(pIVar6->IO).MousePos, local_88.Min.x < pIVar1->x || local_88.Min.x == pIVar1->x))
    {
      if ((fVar22 <= 0.0) || ((pIVar6->IO).MousePos.x <= local_88.Max.x)) goto LAB_002ef702;
      IVar9 = '\x01';
    }
    else {
      IVar9 = -1;
    }
    if (tab_bar->ReorderRequestTabId != 0) {
      __assert_fail("tab_bar->ReorderRequestTabId == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_widgets.cpp"
                    ,0x1a1b,
                    "void ImGui::TabBarQueueChangeTabOrder(ImGuiTabBar *, const ImGuiTabItem *, int)"
                   );
    }
    tab_bar->ReorderRequestTabId = pIVar17->ID;
    tab_bar->ReorderRequestDir = IVar9;
  }
LAB_002ef702:
  draw_list = this->DrawList;
  idx = 0x22;
  if ((local_68.x._0_1_ == '\0') && (local_60.x._0_1_ == '\0')) {
    if (bVar21 == false) {
      idx = (uint)((local_74 >> 0x15 & 1) == 0) * 3 + 0x21;
    }
    else {
      idx = (uint)((local_74 >> 0x15 & 1) == 0) * 2 + 0x23;
    }
  }
  col = GetColorU32(idx,1.0);
  TabItemBackground(draw_list,&local_88,flags_00,col);
  RenderNavHighlight(&local_88,id,1);
  bVar8 = IsItemHovered(8);
  if ((bVar8) && ((bVar8 = IsMouseClicked(1,false), bVar8 || (bVar8 = IsMouseReleased(1), bVar8))))
  {
    tab_bar->NextSelectedTabId = id;
  }
  uVar19 = (uint)tab_bar->Flags >> 1 & 4 | local_6c;
  if (local_58 == (bool *)0x0) {
    TabItemLabelAndCloseButton(draw_list,&local_88,uVar19,tab_bar->FramePadding,pcVar7,id,0);
  }
  else {
    close_button_id = ImGuiWindow::GetID(this,(void *)((ulong)id + 1));
    bVar8 = TabItemLabelAndCloseButton
                      (draw_list,&local_88,uVar19,tab_bar->FramePadding,pcVar7,id,close_button_id);
    if (bVar8) {
      *local_58 = false;
      if (tab_bar->VisibleTabId == pIVar17->ID) {
        if ((pIVar17->Flags & 1U) == 0) {
          pIVar17->LastFrameVisible = -1;
          tab_bar->SelectedTabId = 0;
          tab_bar->NextSelectedTabId = 0;
        }
      }
      else if ((pIVar17->Flags & 1U) != 0) {
        tab_bar->NextSelectedTabId = pIVar17->ID;
      }
    }
  }
  if ((local_48 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    PopClipRect();
  }
  (this->DC).CursorPos = IVar3;
  if ((((pIVar6->HoveredId == id) && (local_68.x._0_1_ == '\0')) &&
      (0.5 < pIVar6->HoveredIdNotActiveTimer)) &&
     ((bVar8 = IsItemHovered(0), bVar8 && ((tab_bar->Flags & 0x20) == 0)))) {
    pcVar13 = FindRenderedTextEnd(pcVar7,(char *)0x0);
    SetTooltip("%.*s",(ulong)(uint)((int)pcVar13 - (int)pcVar7),pcVar7);
  }
  return bVar21;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render. We make a dummy call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    if (p_open && !*p_open)
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return false;
    }

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (short)tab_bar->Tabs.index_from_ptr(tab);
    tab->WidthContents = size.x;

    if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;

    // Append name with zero-terminator
    tab->NameOffset = tab_bar->TabsNames.size();
    tab_bar->TabsNames.append(label, label + strlen(label) + 1);

    // If we are not reorderable, always reset offset based on submission order.
    // (We already handled layout and sizing using the previous known order, but sizing is not affected by order!)
    if (!tab_appearing && !(tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
    {
        tab->Offset = tab_bar->OffsetNextTab;
        tab_bar->OffsetNextTab += tab->Width + g.Style.ItemInnerSpacing.x;
    }

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        tab_bar->NextSelectedTabId = id;

    // Lock visibility
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    if (tab_appearing && !(tab_bar_appearing && !tab_is_new))
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    size.x = tab->Width;
    window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2((float)(int)tab->Offset - tab_bar->ScrollingAnim, 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    bool want_clip_rect = (bb.Min.x < tab_bar->BarRect.Min.x) || (bb.Max.x >= tab_bar->BarRect.Max.x);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->BarRect.Min.x), bb.Min.y - 1), ImVec2(tab_bar->BarRect.Max.x, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = (ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed)
        tab_bar->NextSelectedTabId = id;
    hovered |= (g.HoveredId == id);

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (!held)
        SetItemAllowOverlap();

    // Drag and drop: re-order tabs
    if (held && !tab_appearing && IsMouseDragging(0))
    {
        if (!g.DragDropActive && (tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, -1);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, +1);
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > 0.50f && bb.GetWidth() < tab->WidthContents)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + (float)(int)ImLerp(bb.GetWidth(), tab->WidthContents, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? window->GetID((void*)((intptr_t)id + 1)) : 0;
    bool just_closed = TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip (FIXME: Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer)
    // We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar (which g.HoveredId ignores)
    if (g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > 0.50f && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    return tab_contents_visible;
}